

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

int __thiscall
boost::runtime::cla::parser::parse(parser *this,int argc,char **argv,arguments_store *res)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  type pbVar6;
  ostream *poVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  char *pcVar9;
  char *pcVar10;
  bool negative_form;
  basic_param_ptr found_param;
  argv_traverser tr;
  cstring value_separator;
  cstring name;
  cstring prefix;
  trie_ptr curr_trie;
  locate_result locate_res;
  bool local_2d9;
  shared_ptr<boost::runtime::basic_param> local_2d8;
  argv_traverser local_2c8;
  cstring local_2a8;
  cstring local_298;
  arguments_store *local_280;
  key_type local_278;
  trie_ptr local_268;
  element_type *local_258;
  shared_count local_250;
  str_to_trie *local_248;
  basic_cstring<const_char> local_240;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_230;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_1f8;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_1c0;
  duplicate_arg local_188;
  char *local_150;
  char *local_148;
  cstring local_140;
  basic_cstring<const_char> local_130;
  cstring local_120;
  cstring local_110;
  undefined **local_100;
  pointer local_f8;
  pointer local_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  cstring local_c8;
  basic_cstring<const_char> local_b8;
  locate_result local_a8;
  
  local_280 = res;
  unit_test::basic_cstring<const_char>::operator=(&this->m_program_name,*argv);
  sVar2 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length("\\/");
  pcVar3 = unit_test::utils::find_last_of<char_const*,char_const*>
                     ((this->m_program_name).m_begin,(this->m_program_name).m_end,"\\/",
                      "\\/" + sVar2);
  pcVar10 = (this->m_program_name).m_end;
  if (pcVar3 != pcVar10) {
    pcVar4 = pcVar3 + 1;
    if (pcVar10 <= pcVar3 + 1) {
      pcVar4 = pcVar10;
    }
    (this->m_program_name).m_begin = pcVar4;
  }
  argv_traverser::argv_traverser(&local_2c8,argc,argv);
  local_248 = &this->m_param_trie;
  do {
    if (local_2c8.m_curr_token == local_2c8.m_argc) {
LAB_00191a14:
      return (int)local_2c8.m_curr_token;
    }
    pcVar10 = local_2c8.m_argv[local_2c8.m_curr_token];
    pcVar3 = pcVar10 + local_2c8.m_token_size;
    local_278.m_begin = "";
    local_278.m_end = "";
    local_298.m_begin = "";
    local_298.m_end = "";
    local_2a8.m_begin = "";
    local_2a8.m_end = "";
    local_2d9 = false;
    local_110.m_begin = pcVar10;
    local_110.m_end = pcVar3;
    bVar1 = validate_token_format(this,&local_110,&local_278,&local_298,&local_2a8,&local_2d9);
    if (!bVar1) {
      argv_traverser::next_token(&local_2c8);
      local_2c8.m_curr_token = local_2c8.m_argc;
      goto LAB_00191a14;
    }
    pmVar5 = std::
             map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
             ::operator[](local_248,&local_278);
    local_258 = pmVar5->px;
    local_250.pi_ = (pmVar5->pn).pi_;
    if (local_250.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_250.pi_)->use_count_ = (local_250.pi_)->use_count_ + 1;
      UNLOCK();
    }
    if (local_258 == (element_type *)0x0) {
      local_b8.m_begin = (this->m_program_name).m_begin;
      local_b8.m_end = (this->m_program_name).m_end;
      local_240.m_begin = pcVar10;
      local_240.m_end = pcVar3;
      poVar7 = std::operator<<((ostream *)&std::cerr,"Boost.Test WARNING: token \"");
      pbVar8 = unit_test::operator<<(poVar7,&local_240);
      poVar7 = std::operator<<(pbVar8,"\" does not correspond to the Boost.Test argument \n");
      poVar7 = std::operator<<(poVar7,
                               "                    and should be placed after all Boost.Test arguments and the -- separator.\n"
                              );
      poVar7 = std::operator<<(poVar7,"                    For example: ");
      pbVar8 = unit_test::operator<<(poVar7,&local_b8);
      poVar7 = std::operator<<(pbVar8," --random -- ");
      pbVar8 = unit_test::operator<<(poVar7,&local_240);
      std::operator<<(pbVar8,"\n");
      argv_traverser::save_token(&local_2c8);
    }
    else {
      pcVar4 = pcVar10 + ((long)local_278.m_end - (long)local_278.m_begin);
      if (pcVar3 <= pcVar10 + ((long)local_278.m_end - (long)local_278.m_begin)) {
        pcVar4 = pcVar3;
      }
      if (local_250.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_250.pi_)->use_count_ = (local_250.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_c8.m_begin = local_298.m_begin;
      local_c8.m_end = local_298.m_end;
      local_268.px = local_258;
      local_268.pn.pi_ = local_250.pi_;
      local_120.m_begin = pcVar4;
      local_120.m_end = pcVar3;
      locate_parameter(&local_a8,this,&local_268,&local_c8,&local_120);
      detail::shared_count::~shared_count(&local_268.pn);
      local_2d8.px = local_a8.second.px;
      local_2d8.pn.pi_ = local_a8.second.pn.pi_;
      if (local_a8.second.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_a8.second.pn.pi_)->use_count_ = (local_a8.second.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      pcVar10 = pcVar4;
      if (local_2d9 == true) {
        if (local_a8.first.m_negatable == false) {
          pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
          local_230.super_input_error.super_param_error.param_name.m_begin =
               (pbVar6->p_name)._M_dataplus._M_p;
          local_230.super_input_error.super_param_error.param_name.m_end =
               local_230.super_input_error.super_param_error.param_name.m_begin +
               (pbVar6->p_name)._M_string_length;
          local_230.super_input_error.super_param_error.msg._M_dataplus._M_p =
               (pointer)&local_230.super_input_error.super_param_error.msg.field_2;
          local_230.super_input_error.super_param_error.msg._M_string_length = 0;
          local_230.super_input_error.super_param_error.msg.field_2._M_local_buf[0] = '\0';
          local_230.super_input_error.super_param_error._0_8_ = &PTR__param_error_001e0f90;
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<((format_error *)&local_1f8,&local_230,"Parameter tag ");
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    ((format_error *)&local_1c0,
                     (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                      *)&local_1f8,&local_a8.first.m_tag);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<((format_error *)&local_188,&local_1c0," is not negatable.");
          unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                    ((format_error *)&local_188);
        }
        pcVar10 = pcVar4 + (this->m_negation_prefix)._M_string_length;
        if (pcVar3 <= pcVar4 + (this->m_negation_prefix)._M_string_length) {
          pcVar10 = pcVar3;
        }
      }
      pcVar4 = pcVar10 + ((long)local_298.m_end - (long)local_298.m_begin);
      if (pcVar3 <= pcVar10 + ((long)local_298.m_end - (long)local_298.m_begin)) {
        pcVar4 = pcVar3;
      }
      if (local_2a8.m_end == local_2a8.m_begin) {
        pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
        pcVar10 = "";
        pcVar9 = "";
        if ((pbVar6->p_has_optional_value).super_class_property<bool>.value == false)
        goto LAB_00191824;
      }
      else {
LAB_00191824:
        bVar1 = unit_test::operator==(&local_2a8,&local_a8.first.m_value_separator);
        if (!bVar1) {
          pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
          local_f8 = (pbVar6->p_name)._M_dataplus._M_p;
          local_f0 = local_f8 + (pbVar6->p_name)._M_string_length;
          local_e8._M_p = (pointer)&local_d8;
          local_e0 = 0;
          local_d8._M_local_buf[0] = '\0';
          local_100 = &PTR__param_error_001e0f90;
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<((format_error *)&local_230,
                     (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                      *)&local_100,"Invalid separator for the parameter ");
          pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    ((format_error *)&local_1f8,
                     (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                      *)&local_230,&pbVar6->p_name);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<((format_error *)&local_1c0,&local_1f8," in the argument ");
          if (local_2c8.m_curr_token == local_2c8.m_argc) {
            local_130.m_begin = "";
            local_130.m_end = "";
          }
          else {
            local_130.m_begin = local_2c8.m_argv[local_2c8.m_curr_token];
            local_130.m_end = local_130.m_begin + local_2c8.m_token_size;
          }
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    ((format_error *)&local_188,
                     (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                      *)&local_1c0,&local_130);
          unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                    ((format_error *)&local_188);
        }
        pcVar10 = pcVar4 + ((long)local_2a8.m_end - (long)local_2a8.m_begin);
        pcVar9 = pcVar3;
        if (pcVar3 <= pcVar10) {
          argv_traverser::next_token(&local_2c8);
          if (local_2c8.m_curr_token == local_2c8.m_argc) goto LAB_00191a26;
          pcVar10 = local_2c8.m_argv[local_2c8.m_curr_token];
          pcVar9 = pcVar10 + local_2c8.m_token_size;
        }
        if (pcVar9 == pcVar10) {
LAB_00191a26:
          pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
          local_f8 = (pbVar6->p_name)._M_dataplus._M_p;
          local_f0 = local_f8 + (pbVar6->p_name)._M_string_length;
          local_e8._M_p = (pointer)&local_d8;
          local_e0 = 0;
          local_d8._M_local_buf[0] = '\0';
          local_100 = &PTR__param_error_001e0f90;
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<((format_error *)&local_230,
                     (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                      *)&local_100,"Missing an argument value for the parameter ");
          pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    ((format_error *)&local_1f8,
                     (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                      *)&local_230,&pbVar6->p_name);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<((format_error *)&local_1c0,&local_1f8," in the argument ");
          if (local_2c8.m_curr_token == local_2c8.m_argc) {
            local_130.m_begin = "";
            local_130.m_end = "";
          }
          else {
            local_130.m_begin = local_2c8.m_argv[local_2c8.m_curr_token];
            local_130.m_end = local_130.m_begin + local_2c8.m_token_size;
          }
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    ((format_error *)&local_188,
                     (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                      *)&local_1c0,&local_130);
          unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                    ((format_error *)&local_188);
        }
      }
      pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
      local_140.m_begin = (pbVar6->p_name)._M_dataplus._M_p;
      local_140.m_end = local_140.m_begin + (pbVar6->p_name)._M_string_length;
      bVar1 = arguments_store::has(local_280,&local_140);
      if (bVar1) {
        pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
        if (pbVar6->p_repeatable == false) {
          pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
          local_f8 = (pbVar6->p_name)._M_dataplus._M_p;
          local_f0 = local_f8 + (pbVar6->p_name)._M_string_length;
          local_e8._M_p = (pointer)&local_d8;
          local_e0 = 0;
          local_d8._M_local_buf[0] = '\0';
          local_100 = &PTR__param_error_001e1e88;
          specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>::
          operator<<((duplicate_arg *)&local_230,
                     (specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>
                      *)&local_100,"Duplicate argument value for the parameter ");
          pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
          specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>::
          operator<<((duplicate_arg *)&local_1f8,
                     (specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>
                      *)&local_230,&pbVar6->p_name);
          specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>::
          operator<<((duplicate_arg *)&local_1c0,
                     (specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>
                      *)&local_1f8," in the argument ");
          if (local_2c8.m_curr_token == local_2c8.m_argc) {
            local_130.m_begin = "";
            local_130.m_end = "";
          }
          else {
            local_130.m_begin = local_2c8.m_argv[local_2c8.m_curr_token];
            local_130.m_end = local_130.m_begin + local_2c8.m_token_size;
          }
          specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>::
          operator<<(&local_188,
                     (specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>
                      *)&local_1c0,&local_130);
          unit_test::ut_detail::throw_exception<boost::runtime::duplicate_arg>(&local_188);
        }
      }
      pbVar6 = shared_ptr<boost::runtime::basic_param>::operator->(&local_2d8);
      local_150 = pcVar10;
      local_148 = pcVar9;
      (*pbVar6->_vptr_basic_param[3])(pbVar6,&local_150,(ulong)local_2d9,local_280);
      argv_traverser::next_token(&local_2c8);
      detail::shared_count::~shared_count(&local_2d8.pn);
      std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
      ~pair(&local_a8);
    }
    detail::shared_count::~shared_count(&local_250);
  } while( true );
}

Assistant:

int
    parse( int argc, char** argv, runtime::arguments_store& res )
    {
        // save program name for help message
        m_program_name = argv[0];
        cstring path_sep( "\\/" );

        cstring::iterator it = unit_test::utils::find_last_of( m_program_name.begin(), m_program_name.end(),
                                                                path_sep.begin(), path_sep.end() );
        if( it != m_program_name.end() )
            m_program_name.trim_left( it + 1 );

        // Set up the traverser
        argv_traverser tr( argc, (char const**)argv );

        // Loop till we reach end of input
        while( !tr.eoi() ) {
            cstring curr_token = tr.current_token();

            cstring prefix;
            cstring name;
            cstring value_separator;
            bool    negative_form = false;

            // Perform format validations and split the argument into prefix, name and separator
            // False return value indicates end of params indicator is met
            if( !validate_token_format( curr_token, prefix, name, value_separator, negative_form ) ) {
                // get rid of "end of params" token
                tr.next_token();
                break;
            }

            // Locate trie corresponding to found prefix and skip it in the input
            trie_ptr curr_trie = m_param_trie[prefix];

            if( !curr_trie ) {
                //  format_error() << "Unrecognized parameter prefix in the argument " << tr.current_token()
                rt_cla_detail::report_foreing_token( m_program_name, curr_token );
                tr.save_token();
                continue;
            }

            curr_token.trim_left( prefix.size() );

            // Locate parameter based on a name and skip it in the input
            locate_result locate_res = locate_parameter( curr_trie, name, curr_token );
            parameter_cla_id const& found_id    = locate_res.first;
            basic_param_ptr         found_param = locate_res.second;

            if( negative_form ) {
                BOOST_TEST_I_ASSRT( found_id.m_negatable,
                                    format_error( found_param->p_name ) 
                                        << "Parameter tag " << found_id.m_tag << " is not negatable." );

                curr_token.trim_left( m_negation_prefix.size() );
            }

            curr_token.trim_left( name.size() );

            cstring value;

            // Skip validations if parameter has optional value and we are at the end of token
            if( !value_separator.is_empty() || !found_param->p_has_optional_value ) {
                // Validate and skip value separator in the input
                BOOST_TEST_I_ASSRT( found_id.m_value_separator == value_separator,
                                    format_error( found_param->p_name ) 
                                        << "Invalid separator for the parameter "
                                        << found_param->p_name
                                        << " in the argument " << tr.current_token() );

                curr_token.trim_left( value_separator.size() );

                // Deduce value source
                value = curr_token;
                if( value.is_empty() ) {
                    tr.next_token();
                    value = tr.current_token();
                }

                BOOST_TEST_I_ASSRT( !value.is_empty(),
                                    format_error( found_param->p_name )
                                        << "Missing an argument value for the parameter "
                                        << found_param->p_name
                                        << " in the argument " << tr.current_token() );
            }

            // Validate against argument duplication
            BOOST_TEST_I_ASSRT( !res.has( found_param->p_name ) || found_param->p_repeatable,
                                duplicate_arg( found_param->p_name )
                                    << "Duplicate argument value for the parameter "
                                    << found_param->p_name
                                    << " in the argument " << tr.current_token() );

            // Produce argument value
            found_param->produce_argument( value, negative_form, res );

            tr.next_token();
        }

        // generate the remainder and return it's size
        return tr.remainder();
    }